

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsetable.cpp
# Opt level: O0

void __thiscall ParseTable::operator()(ParseTable *this,Automaton *aut)

{
  Data *pDVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  QTextStream *pQVar5;
  pointer pIVar6;
  _List_iterator<QString> *p_Var7;
  _List_iterator<State> *p_Var8;
  difference_type dVar9;
  pointer pSVar10;
  reference pQVar11;
  Grammar *in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  Name *la;
  set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
  *__range3;
  bool first;
  int index;
  int rindex;
  Grammar *g;
  iterator arrow_1;
  iterator __end3;
  iterator __begin3;
  ItemPointer item_1;
  iterator arrow;
  ItemPointer item;
  StatePointer state;
  RulePointer rule;
  set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
  lookaheads;
  Item *in_stack_fffffffffffffdd8;
  Grammar *in_stack_fffffffffffffde0;
  Automaton *in_stack_fffffffffffffde8;
  _List_iterator<State> in_stack_fffffffffffffdf0;
  _List_iterator<State> in_stack_fffffffffffffdf8;
  QTextStream *in_stack_fffffffffffffe00;
  QTextStream *in_stack_fffffffffffffe08;
  Data *in_stack_fffffffffffffe10;
  bool local_1a9;
  int local_140;
  int local_13c;
  _Self local_118;
  _List_node_base *local_110;
  _List_node_base *local_108;
  iterator local_100;
  iterator local_f8;
  _List_node_base *local_f0;
  _Self local_e8;
  _Self local_e0;
  _Self local_d8;
  _Self local_d0;
  _Self local_c8;
  _List_node_base *local_c0;
  _List_node_base *local_b8;
  iterator local_b0;
  iterator local_a8;
  _Self local_a0;
  _Self local_98;
  _Self local_90;
  _Self local_88;
  _Self local_80;
  _Self local_78;
  _Self local_70;
  undefined1 local_68 [48];
  undefined1 local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (in_RSI->merged_output).d.d;
  local_13c = 1;
  local_70._M_node = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
  local_70._M_node =
       (_List_node_base *)
       std::__cxx11::list<Rule,_std::allocator<Rule>_>::begin
                 ((list<Rule,_std::allocator<Rule>_> *)in_stack_fffffffffffffde0);
  while( true ) {
    local_78._M_node =
         (_List_node_base *)
         std::__cxx11::list<Rule,_std::allocator<Rule>_>::end
                   ((list<Rule,_std::allocator<Rule>_> *)in_stack_fffffffffffffde0);
    bVar2 = std::operator!=(&local_70,&local_78);
    if (!bVar2) break;
    pQVar5 = (QTextStream *)QTextStream::operator<<((QTextStream *)*in_RDI,local_13c);
    QTextStream::operator<<(pQVar5,")\t");
    std::_List_iterator<Rule>::operator*((_List_iterator<Rule> *)0x144c63);
    operator<<((QTextStream *)in_stack_fffffffffffffdf8._M_node,
               (Rule *)in_stack_fffffffffffffdf0._M_node);
    operator<<((QTextStream *)in_stack_fffffffffffffde0,
               (QTextStreamFunction)in_stack_fffffffffffffdd8);
    std::_List_iterator<Rule>::operator++(&local_70);
    local_13c = local_13c + 1;
  }
  operator<<((QTextStream *)in_stack_fffffffffffffde0,(QTextStreamFunction)in_stack_fffffffffffffdd8
            );
  operator<<((QTextStream *)in_stack_fffffffffffffde0,(QTextStreamFunction)in_stack_fffffffffffffdd8
            );
  local_140 = 0;
  local_80._M_node = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
  local_80._M_node =
       (_List_node_base *)
       std::__cxx11::list<State,_std::allocator<State>_>::begin
                 ((list<State,_std::allocator<State>_> *)in_stack_fffffffffffffde0);
  while( true ) {
    local_88._M_node =
         (_List_node_base *)
         std::__cxx11::list<State,_std::allocator<State>_>::end
                   ((list<State,_std::allocator<State>_> *)in_stack_fffffffffffffde0);
    bVar2 = std::operator!=(&local_80,&local_88);
    if (!bVar2) break;
    pQVar5 = (QTextStream *)QTextStream::operator<<((QTextStream *)*in_RDI,"state ");
    QTextStream::operator<<(pQVar5,local_140);
    operator<<((QTextStream *)in_stack_fffffffffffffde0,
               (QTextStreamFunction)in_stack_fffffffffffffdd8);
    operator<<((QTextStream *)in_stack_fffffffffffffde0,
               (QTextStreamFunction)in_stack_fffffffffffffdd8);
    local_90._M_node = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
    std::_List_iterator<State>::operator->((_List_iterator<State> *)0x144d90);
    local_90._M_node =
         (_List_node_base *)
         std::__cxx11::list<Item,_std::allocator<Item>_>::begin
                   ((list<Item,_std::allocator<Item>_> *)in_stack_fffffffffffffde0);
    while( true ) {
      std::_List_iterator<State>::operator->((_List_iterator<State> *)0x144dad);
      local_98._M_node =
           (_List_node_base *)
           std::__cxx11::list<Item,_std::allocator<Item>_>::end
                     ((list<Item,_std::allocator<Item>_> *)in_stack_fffffffffffffde0);
      bVar2 = std::operator!=(&local_90,&local_98);
      if (!bVar2) break;
      QTextStream::operator<<((QTextStream *)*in_RDI," *  ");
      std::_List_iterator<Item>::operator*((_List_iterator<Item> *)0x144e07);
      operator<<((QTextStream *)in_stack_fffffffffffffdf0._M_node,(Item *)in_stack_fffffffffffffde8)
      ;
      pIVar6 = std::_List_iterator<Item>::operator->((_List_iterator<Item> *)0x144e24);
      std::_List_iterator<Item>::operator->((_List_iterator<Item> *)0x144e3d);
      local_a0._M_node = (_List_node_base *)Item::end_rhs(in_stack_fffffffffffffdd8);
      bVar2 = std::operator==(&pIVar6->dot,&local_a0);
      if (bVar2) {
        QTextStream::operator<<((QTextStream *)*in_RDI," ");
        QMap<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
        ::operator[]((QMap<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
                      *)in_stack_fffffffffffffe10,(_List_iterator<Item> *)in_stack_fffffffffffffe08)
        ;
        operator<<((QTextStream *)in_stack_fffffffffffffdf0._M_node,
                   (NameSet *)in_stack_fffffffffffffde8);
      }
      operator<<((QTextStream *)in_stack_fffffffffffffde0,
                 (QTextStreamFunction)in_stack_fffffffffffffdd8);
      std::_List_iterator<Item>::operator++(&local_90);
    }
    bVar2 = true;
    local_a8._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
    std::_List_iterator<State>::operator->((_List_iterator<State> *)0x144efd);
    local_a8._M_node =
         (_Base_ptr)
         QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::begin
                   ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)
                    in_stack_fffffffffffffdf0._M_node);
    while( true ) {
      std::_List_iterator<State>::operator->((_List_iterator<State> *)0x144f1e);
      local_b0._M_node =
           (_Base_ptr)
           QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::end
                     ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)
                      in_stack_fffffffffffffdf0._M_node);
      bVar3 = ::operator!=((iterator *)in_stack_fffffffffffffde0,
                           (iterator *)in_stack_fffffffffffffdd8);
      if (!bVar3) break;
      p_Var7 = QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::iterator::key
                         ((iterator *)0x144f6d);
      local_b8 = p_Var7->_M_node;
      bVar3 = Grammar::isTerminal(in_stack_fffffffffffffde0,(Name)in_stack_fffffffffffffdf8._M_node)
      ;
      if (bVar3) {
        if (bVar2) {
          operator<<((QTextStream *)in_stack_fffffffffffffde0,
                     (QTextStreamFunction)in_stack_fffffffffffffdd8);
        }
        bVar2 = false;
        pQVar5 = (QTextStream *)QTextStream::operator<<((QTextStream *)*in_RDI,"    ");
        QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::iterator::key
                  ((iterator *)0x144feb);
        pQVar11 = std::_List_iterator<QString>::operator*((_List_iterator<QString> *)0x144ff3);
        pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,(QString *)pQVar11);
        pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5," shift, and go to state ");
        std::__cxx11::list<State,_std::allocator<State>_>::begin
                  ((list<State,_std::allocator<State>_> *)in_stack_fffffffffffffde0);
        p_Var8 = QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::iterator::
                 operator*((iterator *)0x145040);
        local_c0 = p_Var8->_M_node;
        dVar9 = std::distance<std::_List_iterator<State>>
                          (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
        QTextStream::operator<<(pQVar5,dVar9);
        operator<<((QTextStream *)in_stack_fffffffffffffde0,
                   (QTextStreamFunction)in_stack_fffffffffffffdd8);
      }
      QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::iterator::operator++
                ((iterator *)in_stack_fffffffffffffde0);
    }
    bVar2 = true;
    local_c8._M_node = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
    std::_List_iterator<State>::operator->((_List_iterator<State> *)0x1450b5);
    local_c8._M_node =
         (_List_node_base *)
         std::__cxx11::list<Item,_std::allocator<Item>_>::begin
                   ((list<Item,_std::allocator<Item>_> *)in_stack_fffffffffffffde0);
    while( true ) {
      std::_List_iterator<State>::operator->((_List_iterator<State> *)0x1450d6);
      local_d0._M_node =
           (_List_node_base *)
           std::__cxx11::list<Item,_std::allocator<Item>_>::end
                     ((list<Item,_std::allocator<Item>_> *)in_stack_fffffffffffffde0);
      bVar3 = std::operator!=(&local_c8,&local_d0);
      if (!bVar3) break;
      pIVar6 = std::_List_iterator<Item>::operator->((_List_iterator<Item> *)0x145115);
      std::_List_iterator<Item>::operator->((_List_iterator<Item> *)0x14512b);
      local_d8._M_node = (_List_node_base *)Item::end_rhs(in_stack_fffffffffffffdd8);
      bVar3 = std::operator!=(&pIVar6->dot,&local_d8);
      local_1a9 = true;
      if (!bVar3) {
        pIVar6 = std::_List_iterator<Item>::operator->((_List_iterator<Item> *)0x145167);
        pSVar10 = std::_List_iterator<State>::operator->((_List_iterator<State> *)0x145179);
        local_1a9 = std::operator==(&pIVar6->rule,&pSVar10->defaultReduce);
      }
      if (local_1a9 == false) {
        if (bVar2) {
          operator<<((QTextStream *)in_stack_fffffffffffffde0,
                     (QTextStreamFunction)in_stack_fffffffffffffdd8);
        }
        bVar2 = false;
        memset(local_38,0xaa,0x30);
        memset(local_68,0,0x30);
        std::
        set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
        ::set((set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
               *)0x14520f);
        QMap<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
        ::value((QMap<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
                 *)in_stack_fffffffffffffe00,
                (_List_iterator<Item> *)in_stack_fffffffffffffdf8._M_node,
                (set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                 *)in_stack_fffffffffffffdf0._M_node);
        std::
        set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
        ::~set((set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                *)0x14523e);
        local_e0._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
        local_e0._M_node =
             (_Base_ptr)
             std::
             set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
             ::begin((set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                      *)in_stack_fffffffffffffdd8);
        local_e8._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
        local_e8._M_node =
             (_Base_ptr)
             std::
             set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
             ::end((set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                    *)in_stack_fffffffffffffdd8);
        while (bVar3 = std::operator!=(&local_e0,&local_e8), bVar3) {
          std::_Rb_tree_const_iterator<std::_List_iterator<QString>_>::operator*
                    ((_Rb_tree_const_iterator<std::_List_iterator<QString>_> *)0x1452e5);
          pQVar5 = (QTextStream *)QTextStream::operator<<((QTextStream *)*in_RDI,"    ");
          pQVar11 = std::_List_iterator<QString>::operator*((_List_iterator<QString> *)0x145319);
          pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,(QString *)pQVar11);
          pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5," reduce using rule ");
          pIVar6 = std::_List_iterator<Item>::operator->((_List_iterator<Item> *)0x145354);
          local_f0 = (pIVar6->rule)._M_node;
          iVar4 = Automaton::id(in_stack_fffffffffffffde8,
                                (RulePointer)in_stack_fffffffffffffdf8._M_node);
          pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,iVar4);
          pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5," (");
          std::_List_iterator<Item>::operator->((_List_iterator<Item> *)0x14539e);
          std::_List_iterator<Rule>::operator->((_List_iterator<Rule> *)0x1453a6);
          pQVar11 = std::_List_iterator<QString>::operator*((_List_iterator<QString> *)0x1453ae);
          pQVar5 = (QTextStream *)QTextStream::operator<<(pQVar5,(QString *)pQVar11);
          QTextStream::operator<<(pQVar5,")");
          operator<<((QTextStream *)in_stack_fffffffffffffde0,
                     (QTextStreamFunction)in_stack_fffffffffffffdd8);
          std::_Rb_tree_const_iterator<std::_List_iterator<QString>_>::operator++
                    ((_Rb_tree_const_iterator<std::_List_iterator<QString>_> *)
                     in_stack_fffffffffffffde0);
        }
        std::
        set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
        ::~set((set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                *)0x1453f8);
      }
      std::_List_iterator<Item>::operator++(&local_c8);
    }
    bVar2 = true;
    local_f8._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
    std::_List_iterator<State>::operator->((_List_iterator<State> *)0x14542e);
    local_f8._M_node =
         (_Base_ptr)
         QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::begin
                   ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)
                    in_stack_fffffffffffffdf0._M_node);
    while( true ) {
      std::_List_iterator<State>::operator->((_List_iterator<State> *)0x14544f);
      local_100._M_node =
           (_Base_ptr)
           QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::end
                     ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)
                      in_stack_fffffffffffffdf0._M_node);
      bVar3 = ::operator!=((iterator *)in_stack_fffffffffffffde0,
                           (iterator *)in_stack_fffffffffffffdd8);
      if (!bVar3) break;
      in_stack_fffffffffffffe10 = pDVar1;
      p_Var7 = QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::iterator::key
                         ((iterator *)0x14549b);
      local_108 = p_Var7->_M_node;
      bVar3 = Grammar::isNonTerminal
                        (in_stack_fffffffffffffde0,(Name)in_stack_fffffffffffffdf8._M_node);
      if (bVar3) {
        if (bVar2) {
          operator<<((QTextStream *)in_stack_fffffffffffffde0,
                     (QTextStreamFunction)in_stack_fffffffffffffdd8);
        }
        bVar2 = false;
        in_stack_fffffffffffffe00 =
             (QTextStream *)QTextStream::operator<<((QTextStream *)*in_RDI,"    ");
        QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::iterator::key
                  ((iterator *)0x145513);
        pQVar11 = std::_List_iterator<QString>::operator*((_List_iterator<QString> *)0x14551b);
        pQVar5 = (QTextStream *)
                 QTextStream::operator<<(in_stack_fffffffffffffe00,(QString *)pQVar11);
        in_stack_fffffffffffffe08 = (QTextStream *)QTextStream::operator<<(pQVar5," go to state ");
        std::__cxx11::list<State,_std::allocator<State>_>::begin
                  ((list<State,_std::allocator<State>_> *)in_stack_fffffffffffffde0);
        p_Var8 = QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::iterator::
                 operator*((iterator *)0x145562);
        local_110 = p_Var8->_M_node;
        dVar9 = std::distance<std::_List_iterator<State>>
                          (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
        QTextStream::operator<<(in_stack_fffffffffffffe08,dVar9);
        operator<<((QTextStream *)in_stack_fffffffffffffde0,
                   (QTextStreamFunction)in_stack_fffffffffffffdd8);
      }
      QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::iterator::operator++
                ((iterator *)in_stack_fffffffffffffde0);
    }
    pSVar10 = std::_List_iterator<State>::operator->((_List_iterator<State> *)0x1455bd);
    in_stack_fffffffffffffdf8._M_node = (_List_node_base *)&pSVar10->defaultReduce;
    local_118._M_node =
         (_List_node_base *)
         std::__cxx11::list<Rule,_std::allocator<Rule>_>::end
                   ((list<Rule,_std::allocator<Rule>_> *)in_stack_fffffffffffffde0);
    bVar2 = std::operator!=((_Self *)in_stack_fffffffffffffdf8._M_node,&local_118);
    if (bVar2) {
      pQVar5 = operator<<((QTextStream *)in_stack_fffffffffffffde0,
                          (QTextStreamFunction)in_stack_fffffffffffffdd8);
      in_stack_fffffffffffffde8 =
           (Automaton *)QTextStream::operator<<(pQVar5,"    $default reduce using rule ");
      in_stack_fffffffffffffde0 = in_RSI;
      std::_List_iterator<State>::operator->((_List_iterator<State> *)0x145642);
      iVar4 = Automaton::id(in_stack_fffffffffffffde8,(RulePointer)in_stack_fffffffffffffdf8._M_node
                           );
      pQVar5 = (QTextStream *)
               QTextStream::operator<<((QTextStream *)in_stack_fffffffffffffde8,iVar4);
      in_stack_fffffffffffffdf0._M_node = (_List_node_base *)QTextStream::operator<<(pQVar5," (");
      std::_List_iterator<State>::operator->((_List_iterator<State> *)0x14568d);
      std::_List_iterator<Rule>::operator->((_List_iterator<Rule> *)0x145699);
      pQVar11 = std::_List_iterator<QString>::operator*((_List_iterator<QString> *)0x1456a1);
      pQVar5 = (QTextStream *)
               QTextStream::operator<<
                         ((QTextStream *)in_stack_fffffffffffffdf0._M_node,(QString *)pQVar11);
      QTextStream::operator<<(pQVar5,")");
      operator<<((QTextStream *)in_stack_fffffffffffffde0,
                 (QTextStreamFunction)in_stack_fffffffffffffdd8);
    }
    operator<<((QTextStream *)in_stack_fffffffffffffde0,
               (QTextStreamFunction)in_stack_fffffffffffffdd8);
    std::_List_iterator<State>::operator++(&local_80);
    local_140 = local_140 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ParseTable::operator () (Automaton *aut)
{
  Grammar *g = aut->_M_grammar;

  int rindex = 1;
  for (RulePointer rule = g->rules.begin (); rule != g->rules.end (); ++rule)
    out << rindex++ << ")\t" << *rule << Qt::endl;
  out << Qt::endl << Qt::endl;

  int index = 0;
  for (StatePointer state = aut->states.begin (); state != aut->states.end (); ++state)
    {
      out << "state " << index++ << Qt::endl << Qt::endl;

      for (ItemPointer item = state->kernel.begin (); item != state->kernel.end (); ++item)
        {
          out << " *  " << *item;

          if (item->dot == item->end_rhs ())
            out << " " << aut->lookaheads [item];

          out << Qt::endl;
        }

      bool first = true;
      for (Bundle::iterator arrow = state->bundle.begin (); arrow != state->bundle.end (); ++arrow)
        {
          if (! g->isTerminal (arrow.key ()))
            continue;

          if (first)
            out << Qt::endl;

          first = false;

          out << "    " << *arrow.key () << " shift, and go to state " << std::distance (aut->states.begin (), *arrow) << Qt::endl;
        }

      first = true;
      for (ItemPointer item = state->closure.begin (); item != state->closure.end (); ++item)
        {
          if (item->dot != item->end_rhs () || item->rule == state->defaultReduce)
            continue;

          if (first)
            out << Qt::endl;

          first = false;

          const auto lookaheads = aut->lookaheads.value(item);
          for (const Name &la : lookaheads)
            out << "    " << *la << " reduce using rule " << aut->id (item->rule) << " (" << *item->rule->lhs << ")" << Qt::endl;
        }

      first = true;
      for (Bundle::iterator arrow = state->bundle.begin (); arrow != state->bundle.end (); ++arrow)
        {
          if (! g->isNonTerminal (arrow.key ()))
            continue;

          if (first)
            out << Qt::endl;

          first = false;

          out << "    " << *arrow.key () << " go to state " << std::distance (aut->states.begin (), *arrow) << Qt::endl;
        }

      if (state->defaultReduce != g->rules.end ())
        {
          out << Qt::endl
              << "    $default reduce using rule " << aut->id (state->defaultReduce) << " (" << *state->defaultReduce->lhs << ")" << Qt::endl;
        }

      out << Qt::endl;
    }
}